

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::score_basename_word_prefix_match
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  pointer pcVar1;
  char32_t *pcVar2;
  pointer pCVar3;
  pointer p_Var4;
  char32_t *pcVar5;
  char32_t *pcVar6;
  bool bVar7;
  CharCount CVar8;
  pointer pCVar9;
  pointer pCVar10;
  CharCount CVar11;
  ulong uVar12;
  char32_t *pcVar13;
  char32_t *pcVar14;
  long lVar15;
  
  pcVar13 = (this->item_basename_)._M_current;
  pcVar5 = (this->qit_basename_)._M_current;
  pCVar9 = (this->props_).
           super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
           ._M_impl.super__Vector_impl_data._M_start +
           ((long)pcVar13 -
            (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
  pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var4 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar11 = this->basename_longest_submatch_;
  CVar8 = this->basename_word_gaps_;
  do {
    uVar12 = 0;
LAB_0013539d:
    do {
      pcVar2 = p_Var4[1]._M_current;
      p_Var4 = p_Var4 + 1;
      bVar7 = false;
      do {
        pcVar14 = pcVar5;
        pcVar6 = pcVar13;
        lVar15 = 0;
        pCVar10 = pCVar9;
        while( true ) {
          pCVar9 = pCVar10 + 1;
          pcVar5 = (char32_t *)((long)pcVar14 + lVar15);
          if ((pcVar5 == pcVar2) || (*(char32_t *)((long)pcVar6 + lVar15) != *pcVar5)) break;
          uVar12 = uVar12 + 1;
          if ((pointer)((long)pcVar14 + lVar15 + 4) == pcVar1) {
            if (uVar12 < CVar11) {
              uVar12 = CVar11;
            }
            this->basename_longest_submatch_ = uVar12;
            this->unmatched_suffix_len_ =
                 ((long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish + (-lVar15 - (long)pcVar6) >> 2) -
                 1;
            return;
          }
          lVar15 = lVar15 + 4;
          bVar7 = true;
          pCVar3 = pCVar10 + 1;
          pCVar10 = pCVar9;
          if (pCVar3->word_start != false) {
            pcVar5 = (char32_t *)((long)pcVar14 + lVar15);
            pcVar13 = (char32_t *)((long)pcVar6 + lVar15);
            goto LAB_0013539d;
          }
        }
        if (uVar12 < CVar11) {
          uVar12 = CVar11;
        }
        CVar11 = uVar12;
        this->basename_longest_submatch_ = CVar11;
        uVar12 = 0;
        pcVar13 = (char32_t *)((long)pcVar6 + lVar15 + 4);
      } while (pCVar10[1].word_start == false);
      pcVar5 = (char32_t *)((long)pcVar14 + lVar15);
      pcVar13 = (char32_t *)((long)pcVar6 + lVar15 + 4);
      uVar12 = 0;
    } while (bVar7);
    CVar8 = CVar8 + 1;
    this->basename_word_gaps_ = CVar8;
  } while( true );
}

Assistant:

void score_basename_word_prefix_match() {
    auto item_it = item_basename_;
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    // +1 because the first iteration of the loop skips the word start at the
    // beginning of the basename.
    auto qit_words_it = qit_basename_words_.cbegin() + 1;
    auto query_word_last = *qit_words_it;

    CharCount current_submatch = 0;
    bool any_word_matches = false;

    while (true) {
      if (query_it != query_word_last && *item_it == *query_it) {
        ++query_it;
        current_submatch++;
        any_word_matches = true;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      // At this point we know that the basename *is* a word prefix match, so
      // fully consuming the end of the query should be the only possible way
      // to leave this loop. Hence we skip the comparison to `item_.cend()`.
      // (The same applies to `qit_words_it` and `qit_basename_words_.cend()`
      // below.)
      ++props_it;
      if (props_it->word_start) {
        if (!any_word_matches) {
          basename_word_gaps_++;
        }
        any_word_matches = false;
        ++qit_words_it;
        query_word_last = *qit_words_it;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_.cend() - item_it - 1;
  }